

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O0

void __thiscall QSocks5SocketEngine::~QSocks5SocketEngine(QSocks5SocketEngine *this)

{
  QSocks5Authenticator *pQVar1;
  QTcpSocket *pQVar2;
  QSocks5ConnectData *pQVar3;
  QUdpSocket *pQVar4;
  QSocks5BindData *pQVar5;
  QSocks5SocketEnginePrivate *pQVar6;
  undefined8 *in_RDI;
  QSocks5SocketEnginePrivate *d;
  QSocks5BindData *in_stack_ffffffffffffffc0;
  
  *in_RDI = &PTR_metaObject_0049fb68;
  pQVar6 = d_func((QSocks5SocketEngine *)0x371e7a);
  if (pQVar6->data != (QSocks5Data *)0x0) {
    pQVar1 = pQVar6->data->authenticator;
    if (pQVar1 != (QSocks5Authenticator *)0x0) {
      (*pQVar1->_vptr_QSocks5Authenticator[1])();
    }
    pQVar2 = pQVar6->data->controlSocket;
    if (pQVar2 != (QTcpSocket *)0x0) {
      (**(code **)(*(long *)&pQVar2->super_QAbstractSocket + 0x20))();
    }
  }
  if ((pQVar6->connectData != (QSocks5ConnectData *)0x0) &&
     (pQVar3 = pQVar6->connectData, pQVar3 != (QSocks5ConnectData *)0x0)) {
    QSocks5ConnectData::~QSocks5ConnectData((QSocks5ConnectData *)0x371f0b);
    operator_delete(pQVar3,0x38);
  }
  if (pQVar6->udpData != (QSocks5UdpAssociateData *)0x0) {
    pQVar4 = pQVar6->udpData->udpSocket;
    if (pQVar4 != (QUdpSocket *)0x0) {
      (**(code **)(*(long *)&pQVar4->super_QAbstractSocket + 0x20))();
    }
    in_stack_ffffffffffffffc0 = (QSocks5BindData *)pQVar6->udpData;
    if (in_stack_ffffffffffffffc0 != (QSocks5BindData *)0x0) {
      QSocks5UdpAssociateData::~QSocks5UdpAssociateData
                ((QSocks5UdpAssociateData *)in_stack_ffffffffffffffc0);
      operator_delete(in_stack_ffffffffffffffc0,0x40);
    }
  }
  if ((pQVar6->bindData != (QSocks5BindData *)0x0) &&
     (pQVar5 = pQVar6->bindData, pQVar5 != (QSocks5BindData *)0x0)) {
    QSocks5BindData::~QSocks5BindData(in_stack_ffffffffffffffc0);
    operator_delete(pQVar5,0x40);
  }
  QAbstractSocketEngine::~QAbstractSocketEngine((QAbstractSocketEngine *)0x371fcb);
  return;
}

Assistant:

QSocks5SocketEngine::~QSocks5SocketEngine()
{
    Q_D(QSocks5SocketEngine);

    if (d->data) {
        delete d->data->authenticator;
        delete d->data->controlSocket;
    }
    if (d->connectData)
        delete d->connectData;
#ifndef QT_NO_UDPSOCKET
    if (d->udpData) {
        delete d->udpData->udpSocket;
        delete d->udpData;
    }
#endif
    if (d->bindData)
        delete d->bindData;
}